

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O2

void __thiscall NPC::Attack(NPC *this,Character *target)

{
  World *pWVar1;
  Character *this_00;
  uint uVar2;
  bool bVar3;
  Direction DVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  uint uVar10;
  uint uVar11;
  list<Character_*,_std::allocator<Character_*>_> *plVar12;
  _List_node_base *p_Var13;
  double extraout_XMM0_Qa;
  double dVar14;
  double dVar15;
  allocator<char> local_122;
  allocator<char> local_121;
  PacketBuilder builder;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  formula_vars;
  mapped_type local_a8;
  key_type local_90;
  string local_70;
  string local_50;
  
  ENF(this);
  ENF(this);
  pWVar1 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&formula_vars,"NPCAdjustMaxDam",(allocator<char> *)&builder);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)&formula_vars);
  util::variant::GetInt(pmVar8);
  iVar5 = util::rand();
  std::__cxx11::string::~string((string *)&formula_vars);
  local_a8 = 1.0;
  util::rand();
  if ((((uint)target->direction - (uint)this->direction) + 2 & 0xfffffffb) == 0) {
    pWVar1 = this->map->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&formula_vars,"CriticalRate",(allocator<char> *)&builder);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)&formula_vars);
    dVar14 = util::variant::GetFloat(pmVar8);
    local_a8 = (mapped_type)(-(ulong)(extraout_XMM0_Qa < dVar14) & 0x3ff0000000000000);
    std::__cxx11::string::~string((string *)&formula_vars);
  }
  formula_vars._M_h._M_buckets = &formula_vars._M_h._M_single_bucket;
  formula_vars._M_h._M_bucket_count = 1;
  formula_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  formula_vars._M_h._M_element_count = 0;
  formula_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  formula_vars._M_h._M_rehash_policy._M_next_resize = 0;
  formula_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)&builder);
  FormulaVars(this,&formula_vars,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"target_",(allocator<char> *)&builder);
  Character::FormulaVars(target,&formula_vars,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pWVar1 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>((string *)&builder,"MobRate",&local_121);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)&builder);
  dVar14 = util::variant::GetFloat(pmVar8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"modifier",&local_122);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&formula_vars,&local_90);
  *pmVar9 = 1.0 / dVar14;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"damage",(allocator<char> *)&local_90);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&formula_vars,(key_type *)&builder);
  *pmVar9 = (double)iVar5;
  std::__cxx11::string::~string((string *)&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"critical",(allocator<char> *)&local_90);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&formula_vars,(key_type *)&builder);
  *pmVar9 = local_a8;
  std::__cxx11::string::~string((string *)&builder);
  pWVar1 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"damage",(allocator<char> *)&local_90);
  dVar14 = World::EvalFormula(pWVar1,(string *)&builder,&formula_vars);
  std::__cxx11::string::~string((string *)&builder);
  pWVar1 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"hit_rate",(allocator<char> *)&local_90);
  dVar15 = World::EvalFormula(pWVar1,(string *)&builder,&formula_vars);
  iVar5 = (int)dVar14;
  std::__cxx11::string::~string((string *)&builder);
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  if (dVar15 < extraout_XMM0_Qa) {
    iVar5 = 0;
  }
  iVar7 = target->hp;
  if (iVar5 <= target->hp) {
    iVar7 = iVar5;
  }
  pWVar1 = this->map->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"LimitDamage",(allocator<char> *)&local_90);
  pmVar8 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)&builder);
  bVar3 = util::variant::GetBool(pmVar8);
  std::__cxx11::string::~string((string *)&builder);
  if (bVar3) {
    iVar5 = iVar7;
  }
  target->hp = target->hp - iVar7;
  if (target->party != (Party *)0x0) {
    Party::UpdateHP(target->party,target);
  }
  uVar6 = (uint)this->x - (uint)target->x;
  uVar10 = (uint)this->y - (uint)target->y;
  uVar2 = -uVar6;
  if (0 < (int)uVar6) {
    uVar2 = uVar6;
  }
  uVar11 = -uVar10;
  if (0 < (int)uVar10) {
    uVar11 = uVar10;
  }
  DVar4 = (char)((int)uVar6 >> 0x1f) * -2 + DIRECTION_LEFT;
  if ((uVar2 & 0xff) <= (uVar11 & 0xff)) {
    DVar4 = (-1 < (int)uVar10) * '\x02';
  }
  this->direction = DVar4;
  PacketBuilder::PacketBuilder(&builder,PACKET_NPC,PACKET_PLAYER,0x12);
  PacketBuilder::AddByte(&builder,0xff);
  PacketBuilder::AddChar(&builder,(uint)this->index);
  PacketBuilder::AddChar(&builder,(target->hp == 0) + 1);
  PacketBuilder::AddChar(&builder,(uint)this->direction);
  iVar7 = Character::PlayerID(target);
  PacketBuilder::AddShort(&builder,iVar7);
  PacketBuilder::AddThree(&builder,iVar5);
  iVar7 = (int)(((double)target->hp / (double)target->maxhp) * 100.0);
  iVar5 = 0;
  if (0 < iVar7) {
    iVar5 = iVar7;
  }
  iVar7 = 100;
  if (iVar5 < 100) {
    iVar7 = iVar5;
  }
  PacketBuilder::AddThree(&builder,iVar7);
  PacketBuilder::AddByte(&builder,0xff);
  PacketBuilder::AddByte(&builder,0xff);
  plVar12 = &this->map->characters;
  p_Var13 = (_List_node_base *)plVar12;
  while (p_Var13 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var13->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var13 != (_List_node_base *)plVar12) {
    this_00 = (Character *)p_Var13[1]._M_next;
    if (this_00 != target) {
      bVar3 = Character::InRange(this_00,target);
      if (bVar3) {
        Character::Send(this_00,&builder);
      }
    }
  }
  iVar5 = target->hp;
  if (iVar5 == 0) {
    Character::DeathRespawn(target);
    iVar5 = target->hp;
  }
  PacketBuilder::AddShort(&builder,iVar5);
  PacketBuilder::AddShort(&builder,target->tp);
  Character::Send(target,&builder);
  PacketBuilder::~PacketBuilder(&builder);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&formula_vars._M_h);
  return;
}

Assistant:

void NPC::Attack(Character *target)
{
	int amount = util::rand(this->ENF().mindam, this->ENF().maxdam + static_cast<int>(this->map->world->config["NPCAdjustMaxDam"]));
	double rand = util::rand(0.0, 1.0);
	// Checks if target is facing you
	bool critical = std::abs(int(target->direction) - this->direction) != 2 || rand < static_cast<double>(this->map->world->config["CriticalRate"]);

	std::unordered_map<std::string, double> formula_vars;

	this->FormulaVars(formula_vars);
	target->FormulaVars(formula_vars, "target_");
	formula_vars["modifier"] = 1.0 / static_cast<double>(this->map->world->config["MobRate"]);
	formula_vars["damage"] = amount;
	formula_vars["critical"] = critical;

	amount = this->map->world->EvalFormula("damage", formula_vars);
	double hit_rate = this->map->world->EvalFormula("hit_rate", formula_vars);

	if (rand > hit_rate)
	{
		amount = 0;
	}

	amount = std::max(amount, 0);

	int limitamount = std::min(amount, int(target->hp));

	if (this->map->world->config["LimitDamage"])
	{
		amount = limitamount;
	}

	target->hp -= limitamount;
	if (target->party)
	{
		target->party->UpdateHP(target);
	}

	int xdiff = this->x - target->x;
	int ydiff = this->y - target->y;

	if (std::abs(xdiff) > std::abs(ydiff))
	{
		if (xdiff < 0)
		{
			this->direction = DIRECTION_RIGHT;
		}
		else
		{
			this->direction = DIRECTION_LEFT;
		}
	}
	else
	{
		if (ydiff < 0)
		{
			this->direction = DIRECTION_DOWN;
		}
		else
		{
			this->direction = DIRECTION_UP;
		}
	}

	PacketBuilder builder(PACKET_NPC, PACKET_PLAYER, 18);
	builder.AddByte(255);
	builder.AddChar(this->index);
	builder.AddChar(1 + (target->hp == 0));
	builder.AddChar(this->direction);
	builder.AddShort(target->PlayerID());
	builder.AddThree(amount);
	builder.AddThree(util::clamp<int>(double(target->hp) / double(target->maxhp) * 100.0, 0, 100));
	builder.AddByte(255);
	builder.AddByte(255);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (character == target || !character->InRange(target))
		{
			continue;
		}

		character->Send(builder);
	}

	if (target->hp == 0)
	{
		target->DeathRespawn();
	}

	builder.AddShort(target->hp);
	builder.AddShort(target->tp);

	target->Send(builder);
}